

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.cpp
# Opt level: O3

bool __thiscall
duckdb::ColumnReader::PrepareRead
          (ColumnReader *this,idx_t read_now,data_ptr_t define_out,data_ptr_t repeat_out,
          idx_t result_offset)

{
  uchar value;
  bool bVar1;
  pointer pRVar2;
  ParquetColumnSchema *pPVar3;
  uint32_t batch_size;
  
  pPVar3 = this->column_schema;
  batch_size = (uint32_t)read_now;
  if (pPVar3->max_repeat != 0) {
    pRVar2 = unique_ptr<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>,_true>::
             operator->(&this->repeated_decoder);
    RleBpDecoder::GetBatch<unsigned_char>(pRVar2,repeat_out + result_offset,batch_size);
    pPVar3 = this->column_schema;
  }
  bVar1 = true;
  if (pPVar3->max_define != 0) {
    value = NumericCastImpl<unsigned_char,_unsigned_long,_false>::Convert(pPVar3->max_define);
    if (this->column_schema->max_repeat == 0) {
      pRVar2 = unique_ptr<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>,_true>::
               operator->(&this->defined_decoder);
      bVar1 = RleBpDecoder::HasRepeatedBatch<unsigned_char>(pRVar2,batch_size,value);
      if (bVar1) {
        pRVar2 = unique_ptr<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>,_true>::
                 operator->(&this->defined_decoder);
        pRVar2->repeat_count_ = pRVar2->repeat_count_ - batch_size;
        return true;
      }
    }
    pRVar2 = unique_ptr<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>,_true>::
             operator->(&this->defined_decoder);
    RleBpDecoder::GetBatch<unsigned_char>(pRVar2,define_out + result_offset,batch_size);
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ColumnReader::PrepareRead(idx_t read_now, data_ptr_t define_out, data_ptr_t repeat_out, idx_t result_offset) {
	D_ASSERT(block);

	D_ASSERT(read_now + result_offset <= STANDARD_VECTOR_SIZE);
	D_ASSERT(!page_is_filtered_out);

	if (HasRepeats()) {
		D_ASSERT(repeated_decoder);
		repeated_decoder->GetBatch<uint8_t>(repeat_out + result_offset, read_now);
	}

	if (HasDefines()) {
		D_ASSERT(defined_decoder);
		const auto max_define = NumericCast<uint8_t>(MaxDefine());
		if (!HasRepeats() && defined_decoder->HasRepeatedBatch<uint8_t>(read_now, max_define)) {
			// Fast path: no repeats and all valid
			defined_decoder->GetRepeatedBatch<uint8_t>(read_now, max_define);
			return true;
		}
		defined_decoder->GetBatch<uint8_t>(define_out + result_offset, read_now);
		return false;
	}

	return true; // No defines, so everything is valid
}